

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

void __thiscall arangodb::velocypack::ObjectIterator::next(ObjectIterator *this)

{
  bool bVar1;
  ValueLength VVar2;
  ObjectIterator *in_RDI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffc0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> local_18 [8];
  Slice local_10 [2];
  
  bVar1 = valid(in_RDI);
  if ((((bVar1 ^ 0xffU) & 1) == 0) &&
     (in_RDI->_position = in_RDI->_position + 1, in_RDI->_current != (uint8_t *)0x0)) {
    Slice::Slice(local_10,in_RDI->_current);
    VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_ffffffffffffffc0);
    in_RDI->_current = in_RDI->_current + VVar2;
    this_00 = local_18;
    Slice::Slice((Slice *)this_00,in_RDI->_current);
    VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize(this_00);
    in_RDI->_current = in_RDI->_current + VVar2;
  }
  return;
}

Assistant:

void next() noexcept {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      return;
    }
    ++_position;
    if (_current != nullptr) {
      // skip over key
      _current += Slice(_current).byteSize();
      // skip over value
      _current += Slice(_current).byteSize();
    }
  }